

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O2

void __thiscall
ncnn::CopyTo::resolve_copyto_offset
          (CopyTo *this,Mat *self_blob,int *_woffset,int *_hoffset,int *_doffset,int *_coffset)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  int *piVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int local_48 [6];
  int _axes [4];
  
  pvVar7 = (this->starts).data;
  if ((pvVar7 == (void *)0x0) || ((long)(this->starts).c * (this->starts).cstep == 0)) {
    *_woffset = this->woffset;
    *_hoffset = this->hoffset;
    *_doffset = this->doffset;
    *_coffset = this->coffset;
  }
  else {
    uVar1 = self_blob->dims;
    uVar2 = self_blob->w;
    uVar3 = self_blob->h;
    uVar4 = self_blob->d;
    uVar5 = self_blob->c;
    *_woffset = 0;
    *_hoffset = 0;
    *_doffset = 0;
    *_coffset = 0;
    pvVar8 = (this->axes).data;
    local_48[0] = 0;
    local_48[1] = 1;
    local_48[2] = 2;
    local_48[3] = 3;
    uVar15 = (this->axes).w;
    if (uVar15 == 0) {
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
    }
    else {
      uVar13 = 0;
      uVar12 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        uVar12 = uVar13;
      }
      for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        iVar6 = *(int *)((long)pvVar8 + uVar13 * 4);
        local_48[uVar13] = (iVar6 >> 0x1f & uVar1) + iVar6;
      }
    }
    for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      if (uVar1 - 1 < 4) {
        iVar6 = local_48[uVar13];
        iVar11 = *(int *)((long)pvVar7 + uVar13 * 4);
        piVar10 = _woffset;
        uVar15 = uVar2;
        switch(uVar1) {
        case 2:
          piVar10 = _hoffset;
          piVar9 = _woffset;
          uVar15 = uVar3;
          uVar14 = uVar2;
          if (iVar6 != 0) {
LAB_005318d1:
            piVar10 = piVar9;
            uVar15 = uVar14;
            if (iVar6 != 1) goto switchD_005318f8_default;
          }
          break;
        case 3:
          piVar10 = _coffset;
          uVar15 = uVar5;
          if ((iVar6 != 0) &&
             (piVar10 = _woffset, piVar9 = _hoffset, uVar15 = uVar2, uVar14 = uVar3, iVar6 != 2))
          goto LAB_005318d1;
          break;
        case 4:
          piVar10 = _coffset;
          uVar15 = uVar5;
          switch(iVar6) {
          case 0:
            break;
          case 1:
            piVar10 = _doffset;
            uVar15 = uVar4;
            break;
          case 2:
            piVar10 = _hoffset;
            uVar15 = uVar3;
            break;
          case 3:
            piVar10 = _woffset;
            uVar15 = uVar2;
            break;
          default:
            goto switchD_005318f8_default;
          }
        }
        if (iVar11 == -0xe9) {
          iVar11 = 0;
        }
        *piVar10 = (iVar11 >> 0x1f & uVar15) + iVar11;
      }
switchD_005318f8_default:
    }
  }
  return;
}

Assistant:

void CopyTo::resolve_copyto_offset(const Mat& self_blob, int& _woffset, int& _hoffset, int& _doffset, int& _coffset) const
{
    int w = self_blob.w;
    int h = self_blob.h;
    int d = self_blob.d;
    int channels = self_blob.c;
    int dims = self_blob.dims;

    bool numpy_style_slice = !starts.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _doffset = 0;
        _coffset = 0;

        const int* starts_ptr = starts;
        const int* axes_ptr = axes;

        int _axes[4] = {0, 1, 2, 3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims;
        }
        else
        {
            for (int i = 0; i < num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + axis;
                _axes[i] = axis;
            }
        }

        for (int i = 0; i < num_axis; i++)
        {
            int axis = _axes[i];
            int start = starts_ptr[i];

            if (dims == 1) // axis == 0
            {
                if (start == -233) start = 0;
                _woffset = start >= 0 ? start : w + start;
            }
            if (dims == 2)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    _hoffset = start >= 0 ? start : h + start;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    _woffset = start >= 0 ? start : w + start;
                }
            }
            if (dims == 3)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    _coffset = start >= 0 ? start : channels + start;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    _hoffset = start >= 0 ? start : h + start;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    _woffset = start >= 0 ? start : w + start;
                }
            }
            if (dims == 4)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    _coffset = start >= 0 ? start : channels + start;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    _doffset = start >= 0 ? start : d + start;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    _hoffset = start >= 0 ? start : h + start;
                }
                if (axis == 3)
                {
                    if (start == -233) start = 0;
                    _woffset = start >= 0 ? start : w + start;
                }
            }
        }
    }
    else
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _doffset = doffset;
        _coffset = coffset;
    }
}